

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

OptionStatus
checkOptionValue(HighsLogOptions *report_log_options,OptionRecordInt *option,HighsInt value)

{
  undefined8 uVar1;
  uint in_EDX;
  long in_RSI;
  HighsLogOptions *in_RDI;
  OptionStatus local_4;
  
  if ((int)in_EDX < *(int *)(in_RSI + 0x60)) {
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kWarning,
                 "checkOptionValue: Value %d for option \"%s\" is below lower bound of %d\n",
                 (ulong)in_EDX,uVar1,(ulong)*(uint *)(in_RSI + 0x60));
    local_4 = kIllegalValue;
  }
  else if (*(int *)(in_RSI + 0x68) < (int)in_EDX) {
    uVar1 = std::__cxx11::string::c_str();
    highsLogUser(in_RDI,kWarning,
                 "checkOptionValue: Value %d for option \"%s\" is above upper bound of %d\n",
                 (ulong)in_EDX,uVar1,(ulong)*(uint *)(in_RSI + 0x68));
    local_4 = kIllegalValue;
  }
  else {
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

OptionStatus checkOptionValue(const HighsLogOptions& report_log_options,
                              OptionRecordInt& option, const HighsInt value) {
  if (value < option.lower_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %" HIGHSINT_FORMAT
                 " for option \"%s\" is below "
                 "lower bound of %" HIGHSINT_FORMAT "\n",
                 value, option.name.c_str(), option.lower_bound);
    return OptionStatus::kIllegalValue;
  } else if (value > option.upper_bound) {
    highsLogUser(report_log_options, HighsLogType::kWarning,
                 "checkOptionValue: Value %" HIGHSINT_FORMAT
                 " for option \"%s\" is above "
                 "upper bound of %" HIGHSINT_FORMAT "\n",
                 value, option.name.c_str(), option.upper_bound);
    return OptionStatus::kIllegalValue;
  }
  return OptionStatus::kOk;
}